

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VTKData.h
# Opt level: O0

type __thiscall
VTKPointDescriptor<MercuryParticle<2UL>_>::addProperty<double>
          (VTKPointDescriptor<MercuryParticle<2UL>_> *this,string *name,
          offset_in_MercuryParticle<2UL>_to_double m,bool isPrimary)

{
  byte bVar1;
  vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
  *this_00;
  reference ppVVar2;
  byte in_CL;
  string *in_RSI;
  type in_RDI;
  VTKPointDescriptorEntry<MercuryParticle<2UL>_> *data;
  string local_48 [16];
  size_t in_stack_ffffffffffffffc8;
  offset_in_MercuryParticle<2UL>_to_double in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  this_00 = (vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
             *)operator_new(0x38);
  std::__cxx11::string::string(local_48,in_RSI);
  Detail::VTKPointDescriptorEntryImpl<MercuryParticle<2UL>,_double>::VTKPointDescriptorEntryImpl
            ((VTKPointDescriptorEntryImpl<MercuryParticle<2UL>,_double> *)
             CONCAT17(bVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_48);
  std::
  vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
  ::push_back(this_00,(value_type *)in_RSI);
  if ((bVar1 & 1) != 0) {
    ppVVar2 = std::
              vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
              ::back(&in_RDI->entries_);
    in_RDI->positionEntry_ = *ppVVar2;
  }
  return in_RDI;
}

Assistant:

typename std::enable_if<!std::is_array<DATATYPE>::value, VTKPointDescriptor&>::type
     addProperty(std::string name, DATATYPE T::*m, bool isPrimary = false)
  {
    Detail::VTKPointDescriptorEntry<T> * data
       = new Detail::VTKPointDescriptorEntryImpl<T,DATATYPE>(name, m, 1);
    entries_.push_back(data);
    if (isPrimary)
      positionEntry_ = entries_.back();

    return *this;
  }